

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::extractClassName(string *__return_storage_ptr__,string *classOrQualifiedMethodName)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)classOrQualifiedMethodName);
  std::__cxx11::string::string((string *)&local_38,"&",&local_39);
  bVar1 = startsWith(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x153acf);
    std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x153acf);
    std::__cxx11::string::substr((ulong)&local_38,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string extractClassName( std::string const& classOrQualifiedMethodName ) {
        std::string className = classOrQualifiedMethodName;
        if( startsWith( className, "&" ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }